

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

void tcache_arena_dissociate(tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache)

{
  cache_bin_array_descriptor_t *pcVar1;
  pthread_mutex_t *__mutex;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  arena_t *arena;
  tcache_slow_t *ptVar4;
  tcache_slow_t *ptVar5;
  cache_bin_array_descriptor_t *pcVar6;
  cache_bin_array_descriptor_t *pcVar7;
  int iVar8;
  
  arena = tcache_slow->arena;
  __mutex = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48);
  iVar8 = pthread_mutex_trylock(__mutex);
  if (iVar8 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
    (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  ptVar4 = (arena->tcache_ql).qlh_first;
  if (ptVar4 == tcache_slow) {
    (arena->tcache_ql).qlh_first = (ptVar4->link).qre_next;
  }
  if ((arena->tcache_ql).qlh_first == tcache_slow) {
    (arena->tcache_ql).qlh_first = (tcache_slow_t *)0x0;
  }
  else {
    ptVar4 = (tcache_slow->link).qre_prev;
    (ptVar4->link).qre_next = (((tcache_slow->link).qre_next)->link).qre_prev;
    ptVar5 = (tcache_slow->link).qre_next;
    (ptVar5->link).qre_prev = ptVar4;
    ptVar4 = (((tcache_slow->link).qre_prev)->link).qre_next;
    (tcache_slow->link).qre_prev = ptVar4;
    (((ptVar5->link).qre_prev)->link).qre_next = ptVar5;
    (ptVar4->link).qre_next = tcache_slow;
  }
  pcVar6 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  pcVar1 = &tcache_slow->cache_bin_array_descriptor;
  if (pcVar6 == pcVar1) {
    (arena->cache_bin_array_descriptor_ql).qlh_first = (pcVar6->link).qre_next;
  }
  if ((arena->cache_bin_array_descriptor_ql).qlh_first == pcVar1) {
    (arena->cache_bin_array_descriptor_ql).qlh_first = (cache_bin_array_descriptor_t *)0x0;
  }
  else {
    pcVar6 = (tcache_slow->cache_bin_array_descriptor).link.qre_prev;
    (pcVar6->link).qre_next =
         (((tcache_slow->cache_bin_array_descriptor).link.qre_next)->link).qre_prev;
    pcVar7 = (tcache_slow->cache_bin_array_descriptor).link.qre_next;
    (pcVar7->link).qre_prev = pcVar6;
    pcVar6 = (((tcache_slow->cache_bin_array_descriptor).link.qre_prev)->link).qre_next;
    (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar6;
    (((pcVar7->link).qre_prev)->link).qre_next = pcVar7;
    (pcVar6->link).qre_next = pcVar1;
  }
  duckdb_je_tcache_stats_merge(tsdn,tcache_slow->tcache,arena);
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  tcache_slow->arena = (arena_t *)0x0;
  return;
}

Assistant:

static void
tcache_arena_dissociate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache) {
	arena_t *arena = tcache_slow->arena;
	assert(arena != NULL);
	if (config_stats) {
		/* Unlink from list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
		if (config_debug) {
			bool in_ql = false;
			tcache_slow_t *iter;
			ql_foreach(iter, &arena->tcache_ql, link) {
				if (iter == tcache_slow) {
					in_ql = true;
					break;
				}
			}
			assert(in_ql);
		}
		ql_remove(&arena->tcache_ql, tcache_slow, link);
		ql_remove(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);
		tcache_stats_merge(tsdn, tcache_slow->tcache, arena);
		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
	tcache_slow->arena = NULL;
}